

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithHistoryRecord_Test::
~SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithHistoryRecord_Test
          (SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithHistoryRecord_Test *this)

{
  SolitaireHandWithTwoCardsTest::~SolitaireHandWithTwoCardsTest
            (&this->super_SolitaireHandWithTwoCardsTest);
  operator_delete(this,0x238);
  return;
}

Assistant:

TEST_F(SolitaireHandWithTwoCardsTest, addCardOnTableauPileWithHistoryRecord) {
    auto cardsToAdd {twoCards};

    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock2);
    expectTryingAddCardsAndClearThem(lastTableauPileMock, cardsToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2)
        .WillOnce(Return(ByMove(moveOperationSnapshot.make_unique())));
    EXPECT_CALL(*historyTrackerMock, save(Pointer(moveOperationSnapshot.get())));

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}